

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtGImpactCollisionAlgorithm::convex_vs_convex_collision
          (cbtGImpactCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtCollisionShape *shape0,cbtCollisionShape *shape1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  cbtDispatcher *pcVar5;
  int iVar6;
  undefined4 extraout_var;
  cbtCollisionAlgorithm *pcVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  cbtCollisionObjectWrapper *local_78;
  cbtCollisionShape *local_70;
  cbtCollisionObject *local_68;
  cbtTransform *pcStack_60;
  undefined8 local_58;
  cbtCollisionObjectWrapper *local_50;
  cbtCollisionShape *local_48;
  cbtCollisionObject *local_40;
  cbtTransform *pcStack_38;
  undefined8 local_30;
  cbtPersistentManifold *pcVar7;
  undefined4 extraout_var_00;
  
  (*(this->m_resultOut->super_Result)._vptr_Result[2])
            (this->m_resultOut,(ulong)(uint)this->m_part0,(ulong)(uint)this->m_triface0);
  (*(this->m_resultOut->super_Result)._vptr_Result[3])
            (this->m_resultOut,(ulong)(uint)this->m_part1,(ulong)(uint)this->m_triface1);
  local_40 = body0Wrap->m_collisionObject;
  pcStack_38 = body0Wrap->m_worldTransform;
  uVar1 = this->m_triface0;
  uVar3 = this->m_part0;
  auVar9._4_4_ = uVar3;
  auVar9._0_4_ = uVar1;
  auVar9._8_8_ = 0;
  auVar9 = vshufps_avx(auVar9,auVar9,0xe1);
  local_30 = vmovlps_avx(auVar9);
  local_68 = body1Wrap->m_collisionObject;
  pcStack_60 = body1Wrap->m_worldTransform;
  uVar2 = this->m_triface1;
  uVar4 = this->m_part1;
  auVar10._4_4_ = uVar4;
  auVar10._0_4_ = uVar2;
  auVar10._8_8_ = 0;
  auVar9 = vshufps_avx(auVar10,auVar10,0xe1);
  local_58 = vmovlps_avx(auVar9);
  pcVar8 = this->m_convex_algorithm;
  local_78 = body1Wrap;
  local_70 = shape1;
  local_50 = body0Wrap;
  local_48 = shape0;
  if (pcVar8 == (cbtCollisionAlgorithm *)0x0) {
    pcVar7 = this->m_manifoldPtr;
    if (pcVar7 == (cbtPersistentManifold *)0x0) {
      pcVar5 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
               m_dispatcher;
      iVar6 = (*pcVar5->_vptr_cbtDispatcher[3])(pcVar5,local_40,local_68);
      pcVar7 = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar6);
      this->m_manifoldPtr = pcVar7;
    }
    this->m_resultOut->m_manifoldPtr = pcVar7;
    pcVar5 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.m_dispatcher;
    iVar6 = (*pcVar5->_vptr_cbtDispatcher[2])(pcVar5,&local_50,&local_78,pcVar7,1);
    pcVar8 = (cbtCollisionAlgorithm *)CONCAT44(extraout_var_00,iVar6);
    this->m_convex_algorithm = pcVar8;
  }
  (*pcVar8->_vptr_cbtCollisionAlgorithm[2])
            (pcVar8,&local_50,&local_78,this->m_dispatchInfo,this->m_resultOut);
  return;
}

Assistant:

void cbtGImpactCollisionAlgorithm::convex_vs_convex_collision(
	const cbtCollisionObjectWrapper* body0Wrap,
	const cbtCollisionObjectWrapper* body1Wrap,
	const cbtCollisionShape* shape0,
	const cbtCollisionShape* shape1)
{
	m_resultOut->setShapeIdentifiersA(m_part0, m_triface0);
	m_resultOut->setShapeIdentifiersB(m_part1, m_triface1);

	cbtCollisionObjectWrapper ob0(body0Wrap, shape0, body0Wrap->getCollisionObject(), body0Wrap->getWorldTransform(), m_part0, m_triface0);
	cbtCollisionObjectWrapper ob1(body1Wrap, shape1, body1Wrap->getCollisionObject(), body1Wrap->getWorldTransform(), m_part1, m_triface1);
	checkConvexAlgorithm(&ob0, &ob1);
	m_convex_algorithm->processCollision(&ob0, &ob1, *m_dispatchInfo, m_resultOut);
}